

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communication.c
# Opt level: O1

int decode(uchar *src,int len,uchar *dst,int buf_max)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  
  if (len < 1) {
    iVar5 = 0;
    iVar2 = 0;
  }
  else {
    uVar6 = 0;
    iVar2 = 0;
    iVar5 = 0;
    iVar7 = 0;
    uVar4 = 0;
    uVar3 = 0;
    do {
      bVar1 = src[uVar6];
      if (bVar1 >= 0x40) {
        uVar4 = bVar1 - 0x40;
      }
      iVar2 = iVar2 + (uint)(bVar1 < 0x40);
      uVar3 = (uVar4 & 0xffff) << (10U - (char)iVar7 & 0x1f) | uVar3;
      if (iVar7 < 2) {
        iVar7 = iVar7 + 6;
      }
      else {
        dst[iVar5] = (uchar)(uVar3 >> 8);
        iVar5 = iVar5 + 1;
        if (buf_max <= iVar5) {
          return 0;
        }
        iVar7 = iVar7 + -2;
        uVar3 = (uVar3 & 0xffff) << 8;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)len != uVar6);
  }
  iVar7 = -iVar2;
  if (iVar2 == 0) {
    iVar7 = iVar5;
  }
  return iVar7;
}

Assistant:

int decode(const unsigned char* src, int len, unsigned char* dst, int buf_max)
{
  unsigned short dat, b;
  int pos, s_pos, w_pos;
  int rerr;
  pos = 0;    // read position
  w_pos = 0;  // write_position
  s_pos = 0;  // shift position
  rerr = 0;
  dat = 0;
  b = 0;
  while (pos < len)
  {
    if (src[pos] >= 0x40)
      b = src[pos] - 0x40;
    else
      rerr++;

    dat |= (b << (10 - s_pos));
    s_pos += 6;
    if (s_pos >= 8)
    {
      dst[w_pos] = (dat >> 8);
      w_pos++;
      if (w_pos >= buf_max)
        return 0;
      s_pos -= 8;
      dat = dat << 8;
    }
    pos++;
  }

  if (rerr)
    return -rerr;
  return w_pos;
}